

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_path(PATHFIND_DATA *path)

{
  void *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if ((((*(long *)((long)in_RDI + 0x20) == 0) && (*(long *)((long)in_RDI + 0x28) == 0)) &&
      (*(long *)((long)in_RDI + 0x30) == 0)) &&
     (((*(long *)((long)in_RDI + 0x38) == 0 && (*(long *)((long)in_RDI + 0x40) == 0)) &&
      (*(long *)((long)in_RDI + 0x48) == 0)))) {
    if (in_RDI != (void *)0x0) {
      operator_delete(in_RDI,0x50);
    }
  }
  else {
    for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
      if (*(long *)((long)in_RDI + (long)iVar1 * 8 + 0x20) != 0) {
        free_path((PATHFIND_DATA *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      }
    }
    if (in_RDI != (void *)0x0) {
      operator_delete(in_RDI,0x50);
    }
  }
  return;
}

Assistant:

void free_path(PATHFIND_DATA *path)
{
	if (!path->dir_to[Directions::North]
		&& !path->dir_to[Directions::East]
		&& !path->dir_to[Directions::South]
		&& !path->dir_to[Directions::West]
		&& !path->dir_to[Directions::Up]
		&& !path->dir_to[Directions::Down])
	{
		delete path;
	}
	else
	{
		for (int i = 0; i < 6; i++)
		{
			if (path->dir_to[i])
				free_path(path->dir_to[i]);
		}

		delete path;
	}
}